

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::Calli(w3Interp *this)

{
  ulong __n;
  bool bVar1;
  uint32_t uVar2;
  size_type sVar3;
  reference function_00;
  reference this_00;
  reference other;
  ulong __n_00;
  w3FunctionType *type2;
  w3FunctionType *type1;
  size_t type_index2;
  w3Function *function;
  size_t type_index1;
  size_t function_index;
  w3Interp *this_local;
  
  uVar2 = w3Stack::pop_u32(&this->super_w3Stack);
  __n_00 = (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32;
  sVar3 = std::vector<w3Function,_std::allocator<w3Function>_>::size(&this->module->functions);
  if (sVar3 <= uVar2) {
    AssertFailed("function_index < module->functions.size ()");
  }
  function_00 = std::vector<w3Function,_std::allocator<w3Function>_>::operator[]
                          (&this->module->functions,(ulong)uVar2);
  __n = function_00->function_type_index;
  sVar3 = std::vector<w3FunctionType,_std::allocator<w3FunctionType>_>::size
                    (&this->module->function_types);
  if (sVar3 <= __n_00) {
    AssertFailed("type_index1 < module->function_types.size ()");
  }
  sVar3 = std::vector<w3FunctionType,_std::allocator<w3FunctionType>_>::size
                    (&this->module->function_types);
  if (sVar3 <= __n) {
    AssertFailed("type_index2 < module->function_types.size ()");
  }
  this_00 = std::vector<w3FunctionType,_std::allocator<w3FunctionType>_>::operator[]
                      (&this->module->function_types,__n_00);
  other = std::vector<w3FunctionType,_std::allocator<w3FunctionType>_>::operator[]
                    (&this->module->function_types,__n);
  if (__n != __n_00) {
    bVar1 = w3FunctionType::operator==(this_00,other);
    if (!bVar1) {
      AssertFailed("type_index2 == type_index1 || *type1 == *type2");
    }
  }
  sVar3 = std::vector<w3Tag,_std::allocator<w3Tag>_>::size(&this_00->results);
  if (1 < sVar3) {
    AssertFailed("type1->results.size () <= 1");
  }
  Invoke(this,function_00);
  return;
}

Assistant:

INTERP (Calli)
{
    // TODO signed or unsigned
    // call is unsigned
    const size_t function_index = pop_u32 ();

    const size_t type_index1 = instr->u32;

    // This seems like it could be validated earlier.
    Assert (function_index < module->functions.size ());

    w3Function& function = module->functions [function_index];

    const size_t type_index2 = function.function_type_index;

    Assert (type_index1 < module->function_types.size ());
    Assert (type_index2 < module->function_types.size ());

    const w3FunctionType* type1 = &module->function_types [type_index1];
    const w3FunctionType* type2 = &module->function_types [type_index2];

    Assert (type_index2 == type_index1 || *type1 == *type2);

    Assert (type1->results.size () <= 1); // future

    Invoke (function);
}